

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O2

REF_STATUS ref_geom_add_constrain_inside_midnode(REF_GRID ref_grid,REF_INT *nodes,REF_INT new_node)

{
  REF_INT id;
  REF_NODE pRVar1;
  REF_GEOM ref_geom;
  uint uVar2;
  undefined8 uVar3;
  char *pcVar4;
  undefined1 auVar5 [16];
  REF_INT sense;
  REF_DBL uv2 [2];
  REF_DBL uv1 [2];
  REF_DBL uv0 [2];
  undefined1 local_48 [16];
  
  pRVar1 = ref_grid->node;
  ref_geom = ref_grid->geom;
  id = nodes[3];
  uVar2 = ref_geom_cell_tuv(ref_geom,*nodes,nodes,2,uv0,&sense);
  if (uVar2 == 0) {
    uVar2 = ref_geom_cell_tuv(ref_geom,nodes[1],nodes,2,uv1,&sense);
    if (uVar2 == 0) {
      uVar2 = ref_geom_cell_tuv(ref_geom,nodes[2],nodes,2,uv2,&sense);
      if (uVar2 == 0) {
        auVar5._0_8_ = uv0[0] + uv1[0] + uv2[0];
        auVar5._8_8_ = uv0[1] + uv1[1] + uv2[1];
        local_48 = divpd(auVar5,_DAT_0020c010);
        uVar2 = ref_geom_add(ref_geom,new_node,2,id,(REF_DBL *)local_48);
        if (uVar2 == 0) {
          uVar2 = ref_egads_eval_at(ref_geom,2,id,(REF_DBL *)local_48,pRVar1->real + new_node * 0xf,
                                    (REF_DBL *)0x0);
          if (uVar2 == 0) {
            return 0;
          }
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x3d5,"ref_geom_add_constrain_inside_midnode",(ulong)uVar2,"eval");
          return uVar2;
        }
        pcVar4 = "new geom";
        uVar3 = 0x3d1;
      }
      else {
        pcVar4 = "cell uv2";
        uVar3 = 0x3cd;
      }
    }
    else {
      pcVar4 = "cell uv1";
      uVar3 = 0x3cb;
    }
  }
  else {
    pcVar4 = "cell uv0";
    uVar3 = 0x3c9;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar3,
         "ref_geom_add_constrain_inside_midnode",(ulong)uVar2,pcVar4);
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_geom_add_constrain_inside_midnode(REF_GRID ref_grid,
                                                         REF_INT *nodes,
                                                         REF_INT new_node) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_INT type, id;
  REF_DBL uv[2], uv0[2], uv1[2], uv2[2];
  REF_INT sense;

  type = REF_GEOM_FACE;
  id = nodes[3];

  RSS(ref_geom_cell_tuv(ref_geom, nodes[0], nodes, type, uv0, &sense),
      "cell uv0");
  RSS(ref_geom_cell_tuv(ref_geom, nodes[1], nodes, type, uv1, &sense),
      "cell uv1");
  RSS(ref_geom_cell_tuv(ref_geom, nodes[2], nodes, type, uv2, &sense),
      "cell uv2");

  uv[0] = (uv0[0] + uv1[0] + uv2[0]) / 3.0;
  uv[1] = (uv0[1] + uv1[1] + uv2[1]) / 3.0;
  RSS(ref_geom_add(ref_geom, new_node, type, id, uv), "new geom");

  RSS(ref_egads_eval_at(ref_geom, type, id, uv,
                        ref_node_xyz_ptr(ref_node, new_node), NULL),
      "eval");

  return REF_SUCCESS;
}